

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogText(char *fmt,...)

{
  ImGuiContext *pIVar1;
  char in_AL;
  char *count;
  void *in_RSI;
  __va_list_tag *in_R9;
  char *in_XMM0_Qa;
  ImGuiTextBuffer *in_XMM0_Qb;
  va_list args;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  ImVector<char> *in_stack_ffffffffffffff20;
  ImU64 in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff58;
  ImGuiTextBuffer *in_stack_ffffffffffffff60;
  
  pIVar1 = GImGui;
  if (in_AL != '\0') {
    in_stack_ffffffffffffff58 = in_XMM0_Qa;
    in_stack_ffffffffffffff60 = in_XMM0_Qb;
  }
  if ((GImGui->LogEnabled & 1U) != 0) {
    if (GImGui->LogFile == (ImFileHandle)0x0) {
      ImGuiTextBuffer::appendfv(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_R9);
    }
    else {
      ImVector<char>::resize(in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      ImGuiTextBuffer::appendfv(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_R9);
      count = ImGuiTextBuffer::c_str(&pIVar1->LogBuffer);
      ImGuiTextBuffer::size(&pIVar1->LogBuffer);
      ImFileWrite(in_RSI,in_stack_ffffffffffffff28,(ImU64)count,
                  (ImFileHandle)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
  }
  return;
}

Assistant:

void ImGui::LogText(const char* fmt, ...)
{
    ImGuiContext& g = *GImGui;
    if (!g.LogEnabled)
        return;

    va_list args;
    va_start(args, fmt);
    if (g.LogFile)
    {
        g.LogBuffer.Buf.resize(0);
        g.LogBuffer.appendfv(fmt, args);
        ImFileWrite(g.LogBuffer.c_str(), sizeof(char), (ImU64)g.LogBuffer.size(), g.LogFile);
    }
    else
    {
        g.LogBuffer.appendfv(fmt, args);
    }
    va_end(args);
}